

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall
cmCTest::HandleScriptArguments
          (cmCTest *this,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool *SRArgumentSpecified)

{
  ulong uVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  pointer pPVar5;
  cmCTestScriptHandler *pcVar6;
  char *in_R8;
  bool bVar7;
  static_string_view sVar8;
  string_view varg1;
  string_view varg1_00;
  string_view varg1_01;
  cmCTestScriptHandler *ch_2;
  cmCTestScriptHandler *ch_1;
  cmCTestScriptHandler *ch;
  cmCTest local_48;
  string arg;
  bool *SRArgumentSpecified_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  size_t *i_local;
  cmCTest *this_local;
  
  arg.field_2._8_8_ = SRArgumentSpecified;
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,*i);
  std::__cxx11::string::string((string *)&local_48,(string *)pvVar3);
  sVar8 = ::cm::operator____s("-SP",3);
  varg1._M_len = sVar8.super_string_view._M_str;
  varg1._M_str = "--script-new-process";
  bVar2 = CheckArgument(&local_48,(string *)sVar8.super_string_view._M_len,varg1,in_R8);
  bVar7 = false;
  if (bVar2) {
    uVar1 = *i;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    bVar7 = uVar1 < sVar4 - 1;
  }
  if (bVar7) {
    pPVar5 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    pPVar5->RunConfigurationScript = true;
    *i = *i + 1;
    pcVar6 = GetScriptHandler(this);
    if ((*(byte *)arg.field_2._8_8_ & 1) == 0) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,*i);
      cmCTestScriptHandler::AddConfigurationScript(pcVar6,pvVar3,false);
    }
  }
  sVar8 = ::cm::operator____s("-SR",3);
  varg1_00._M_len = sVar8.super_string_view._M_str;
  varg1_00._M_str = "--script-run";
  bVar2 = CheckArgument(&local_48,(string *)sVar8.super_string_view._M_len,varg1_00,in_R8);
  bVar7 = false;
  if (bVar2) {
    uVar1 = *i;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    bVar7 = uVar1 < sVar4 - 1;
  }
  if (bVar7) {
    *(undefined1 *)arg.field_2._8_8_ = 1;
    pPVar5 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    pPVar5->RunConfigurationScript = true;
    *i = *i + 1;
    pcVar6 = GetScriptHandler(this);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,*i);
    cmCTestScriptHandler::AddConfigurationScript(pcVar6,pvVar3,true);
  }
  sVar8 = ::cm::operator____s("-S",2);
  varg1_01._M_len = sVar8.super_string_view._M_str;
  varg1_01._M_str = "--script";
  bVar2 = CheckArgument(&local_48,(string *)sVar8.super_string_view._M_len,varg1_01,in_R8);
  bVar7 = false;
  if (bVar2) {
    uVar1 = *i;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    bVar7 = uVar1 < sVar4 - 1;
  }
  if (bVar7) {
    pPVar5 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    pPVar5->RunConfigurationScript = true;
    *i = *i + 1;
    pcVar6 = GetScriptHandler(this);
    if ((*(byte *)arg.field_2._8_8_ & 1) == 0) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,*i);
      cmCTestScriptHandler::AddConfigurationScript(pcVar6,pvVar3,true);
    }
  }
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void cmCTest::HandleScriptArguments(size_t& i, std::vector<std::string>& args,
                                    bool& SRArgumentSpecified)
{
  std::string arg = args[i];
  if (this->CheckArgument(arg, "-SP"_s, "--script-new-process") &&
      i < args.size() - 1) {
    this->Impl->RunConfigurationScript = true;
    i++;
    cmCTestScriptHandler* ch = this->GetScriptHandler();
    // -SR is an internal argument, -SP should be ignored when it is passed
    if (!SRArgumentSpecified) {
      ch->AddConfigurationScript(args[i], false);
    }
  }

  if (this->CheckArgument(arg, "-SR"_s, "--script-run") &&
      i < args.size() - 1) {
    SRArgumentSpecified = true;
    this->Impl->RunConfigurationScript = true;
    i++;
    cmCTestScriptHandler* ch = this->GetScriptHandler();
    ch->AddConfigurationScript(args[i], true);
  }

  if (this->CheckArgument(arg, "-S"_s, "--script") && i < args.size() - 1) {
    this->Impl->RunConfigurationScript = true;
    i++;
    cmCTestScriptHandler* ch = this->GetScriptHandler();
    // -SR is an internal argument, -S should be ignored when it is passed
    if (!SRArgumentSpecified) {
      ch->AddConfigurationScript(args[i], true);
    }
  }
}